

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_extra_field_api.c
# Opt level: O0

int zip_file_extra_field_delete(zip_t *za,zip_uint64_t idx,zip_uint16_t ef_idx,zip_flags_t flags)

{
  int iVar1;
  zip_dirent_t *pzVar2;
  zip_extra_field_t *pzVar3;
  zip_dirent_t *de;
  zip_flags_t flags_local;
  zip_uint16_t ef_idx_local;
  zip_uint64_t idx_local;
  zip_t *za_local;
  
  if ((flags & 0x300) == 0) {
    zip_error_set(&za->error,0x12,0);
    za_local._4_4_ = -1;
  }
  else if (((flags & 0x300) == 0x300) && (ef_idx != 0xffff)) {
    zip_error_set(&za->error,0x12,0);
    za_local._4_4_ = -1;
  }
  else {
    pzVar2 = _zip_get_dirent(za,idx,0,(zip_error_t *)0x0);
    if (pzVar2 == (zip_dirent_t *)0x0) {
      za_local._4_4_ = -1;
    }
    else if ((za->ch_flags & 2) == 0) {
      iVar1 = _zip_file_extra_field_prepare_for_change(za,idx);
      if (iVar1 < 0) {
        za_local._4_4_ = -1;
      }
      else {
        pzVar2 = za->entry[idx].changes;
        pzVar3 = _zip_ef_delete_by_id(pzVar2->extra_fields,0xffff,ef_idx,flags);
        pzVar2->extra_fields = pzVar3;
        za_local._4_4_ = 0;
      }
    }
    else {
      zip_error_set(&za->error,0x19,0);
      za_local._4_4_ = -1;
    }
  }
  return za_local._4_4_;
}

Assistant:

ZIP_EXTERN int
zip_file_extra_field_delete(zip_t *za, zip_uint64_t idx, zip_uint16_t ef_idx, zip_flags_t flags) {
    zip_dirent_t *de;

    if ((flags & ZIP_EF_BOTH) == 0) {
	zip_error_set(&za->error, ZIP_ER_INVAL, 0);
	return -1;
    }

    if (((flags & ZIP_EF_BOTH) == ZIP_EF_BOTH) && (ef_idx != ZIP_EXTRA_FIELD_ALL)) {
	zip_error_set(&za->error, ZIP_ER_INVAL, 0);
	return -1;
    }

    if (_zip_get_dirent(za, idx, 0, NULL) == NULL)
	return -1;

    if (ZIP_IS_RDONLY(za)) {
	zip_error_set(&za->error, ZIP_ER_RDONLY, 0);
	return -1;
    }

    if (_zip_file_extra_field_prepare_for_change(za, idx) < 0)
	return -1;

    de = za->entry[idx].changes;

    de->extra_fields = _zip_ef_delete_by_id(de->extra_fields, ZIP_EXTRA_FIELD_ALL, ef_idx, flags);
    return 0;
}